

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O0

uint __thiscall AviWriter::addWord(AviWriter *this,uint word)

{
  uint word_local;
  AviWriter *this_local;
  
  addByte(this,(uchar)word);
  addByte(this,(uchar)(word >> 8));
  addByte(this,(uchar)(word >> 0x10));
  addByte(this,(uchar)(word >> 0x18));
  return 4;
}

Assistant:

unsigned AviWriter::addWord(unsigned word) {
    // Add "word" to the file in little-endian order:
    addByte(word); addByte(word>>8);
    addByte(word>>16); addByte(word>>24);

    return 4;
}